

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O0

void sysbvm_methodDictionary_atPut
               (sysbvm_context_t *context,sysbvm_tuple_t dictionary,sysbvm_tuple_t key,
               sysbvm_tuple_t value)

{
  long lVar1;
  long lVar2;
  _Bool _Var3;
  size_t sVar4;
  sysbvm_size_t sVar5;
  sysbvm_tuple_t sVar6;
  size_t capacityThreshold;
  size_t newSize;
  size_t capacity;
  _Bool isNewElement;
  sysbvm_array_t *storage;
  sysbvm_dictionary_t *dictionaryObject;
  intptr_t elementIndex;
  sysbvm_tuple_t value_local;
  sysbvm_tuple_t key_local;
  sysbvm_tuple_t dictionary_local;
  sysbvm_context_t *context_local;
  
  if ((key != 0x3f) && (_Var3 = sysbvm_tuple_isNonNullPointer(dictionary), _Var3)) {
    dictionaryObject = (sysbvm_dictionary_t *)sysbvm_methodDictionary_scanFor(dictionary,key);
    if ((long)dictionaryObject < 0) {
      sysbvm_methodDictionary_increaseCapacity(context,dictionary);
      dictionaryObject = (sysbvm_dictionary_t *)sysbvm_methodDictionary_scanFor(dictionary,key);
      if ((long)dictionaryObject < 0) {
        sysbvm_error("Dictionary out of memory.");
      }
    }
    lVar1 = *(long *)(dictionary + 0x18);
    lVar2 = *(long *)(lVar1 + 0x10 + (long)dictionaryObject * 0x10);
    *(sysbvm_tuple_t *)(lVar1 + 0x10 + (long)dictionaryObject * 0x10) = key;
    *(sysbvm_tuple_t *)(lVar1 + 0x18 + (long)dictionaryObject * 0x10) = value;
    if (lVar2 == 0x3f) {
      sVar4 = sysbvm_tuple_getSizeInSlots(*(sysbvm_tuple_t *)(dictionary + 0x18));
      sVar5 = sysbvm_tuple_size_decode(*(sysbvm_tuple_t *)(dictionary + 0x10));
      sVar6 = sysbvm_tuple_size_encode(context,sVar5 + 1);
      *(sysbvm_tuple_t *)(dictionary + 0x10) = sVar6;
      if ((sVar4 >> 1) * 3 >> 2 <= sVar5 + 1) {
        sysbvm_methodDictionary_increaseCapacity(context,dictionary);
      }
    }
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_methodDictionary_atPut(sysbvm_context_t *context, sysbvm_tuple_t dictionary, sysbvm_tuple_t key, sysbvm_tuple_t value)
{
    if(key == SYSBVM_HASHTABLE_EMPTY_ELEMENT_TUPLE)
        return;

    if(!sysbvm_tuple_isNonNullPointer(dictionary))
        return;

    intptr_t elementIndex = sysbvm_methodDictionary_scanFor(dictionary, key);
    if(elementIndex < 0)
    {
        sysbvm_methodDictionary_increaseCapacity(context, dictionary);
        elementIndex = sysbvm_methodDictionary_scanFor(dictionary, key);
        if(elementIndex < 0)
           sysbvm_error("Dictionary out of memory.");
    }

    sysbvm_dictionary_t *dictionaryObject = (sysbvm_dictionary_t*)dictionary;
    sysbvm_array_t *storage = (sysbvm_array_t*)dictionaryObject->storage;
    bool isNewElement = storage->elements[elementIndex*2] == SYSBVM_HASHTABLE_EMPTY_ELEMENT_TUPLE;
    storage->elements[elementIndex*2] = key;
    storage->elements[elementIndex*2 + 1] = value;

    // Count the newly inserted element.
    if(isNewElement)
    {
        size_t capacity = sysbvm_tuple_getSizeInSlots(dictionaryObject->storage) / 2;
        size_t newSize = sysbvm_tuple_size_decode(dictionaryObject->size) + 1;
        dictionaryObject->size = sysbvm_tuple_size_encode(context, newSize);
        size_t capacityThreshold = capacity * 3 / 4;

        // Make sure the maximum occupancy rate is not greater than 80%.
        if(newSize >= capacityThreshold)
            sysbvm_methodDictionary_increaseCapacity(context, dictionary);
    }
}